

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void __thiscall argo::json::json(json *this,type t,string *raw_value)

{
  pointer pcVar1;
  json_exception *this_00;
  char *json_type_name;
  
  this->m_type = t;
  (this->m_raw_value)._M_dataplus._M_p = (pointer)&(this->m_raw_value).field_2;
  pcVar1 = (raw_value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_raw_value,pcVar1,pcVar1 + raw_value->_M_string_length);
  if (1 < t - number_int_e) {
    if (t != string_e) {
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      if ((ulong)this->m_type < 7) {
        json_type_name = *(char **)(&DAT_0011b8a8 + (ulong)this->m_type * 8);
      }
      else {
        json_type_name = "corrupted";
      }
      json_exception::json_exception(this_00,not_number_or_string_e,json_type_name);
      __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
    }
    (this->m_value).u_array.
    super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)&this->m_value + 0x10);
    (this->m_value).u_array.
    super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)((long)&this->m_value + 0x10) = 0;
  }
  return;
}

Assistant:

json::json(type t, const string &raw_value) : m_type(t), m_raw_value(raw_value)
{
    if (t != string_e && t != number_int_e && t != number_double_e)
    {
        throw json_exception(json_exception::not_number_or_string_e, get_instance_type_name());
    }

    if (t == string_e)
    {
        construct_string();
    }
}